

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_user_resp(connectdata *conn,int pop3code,pop3state instate)

{
  HTTP *pHVar1;
  char *local_48;
  FTP *pop3;
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  pHVar1 = (conn->data->state).proto.http;
  if (pop3code == 0x2b) {
    if (pHVar1->postdata == (char *)0x0) {
      local_48 = "";
    }
    else {
      local_48 = pHVar1->postdata;
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"PASS %s",local_48);
  }
  else {
    Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)pop3code);
    data._4_4_ = CURLE_LOGIN_DENIED;
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,POP3_PASS);
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_user_resp(struct connectdata *conn,
                                     int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct FTP *pop3 = data->state.proto.pop3;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied. %c", pop3code);
    result = CURLE_LOGIN_DENIED;
  }
  else
    /* Send the PASS command */
    result = Curl_pp_sendf(&conn->proto.pop3c.pp, "PASS %s",
                           pop3->passwd ? pop3->passwd : "");
  if(result)
    return result;

  state(conn, POP3_PASS);

  return result;
}